

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

bool ON_BrepRemoveSlits(ON_BrepLoop *L)

{
  TYPE TVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  TYPE TVar7;
  ON_BrepFace *face;
  ON_Brep *this;
  int *piVar8;
  ON_BrepTrim *pOVar9;
  bool *pbVar10;
  ON_BrepEdge *pOVar11;
  ON_SimpleArray<int> *pOVar12;
  ON_BrepLoop *loop;
  int local_1b4;
  int a;
  ON_BrepTrim *T_3;
  int j_1;
  ON_SimpleArray<int> *nl_2;
  ON_BrepLoop *nL;
  ON_BrepTrim *T_2;
  bool bOuter;
  int j;
  ON_SimpleArray<int> *nl_1;
  int atid;
  ON_BrepEdge *pE;
  ON_BrepTrim *T_1;
  int local_c8;
  int this_trim;
  int c;
  int next_trim;
  ON_SimpleArray<int> *nl;
  int start_trim;
  int b;
  ON_ClassArray<ON_SimpleArray<int>_> NewLoops;
  ON_SimpleArray<bool> bUsed;
  ON_BrepTrim *T;
  int i;
  int tcount;
  bool some_slits;
  bool all_slits;
  undefined1 local_58 [8];
  ON_SimpleArray<int> slits;
  ON_SimpleArray<bool> bIsSlit;
  ON_Brep *pB;
  ON_BrepFace *pF;
  ON_BrepLoop *L_local;
  
  if (L->m_loop_index < 0) {
    L_local._7_1_ = false;
  }
  else {
    face = ON_BrepLoop::Face(L);
    if (face == (ON_BrepFace *)0x0) {
      L_local._7_1_ = false;
    }
    else {
      this = ON_BrepLoop::Brep(L);
      if (this == (ON_Brep *)0x0) {
        L_local._7_1_ = false;
      }
      else {
        iVar5 = ON_SimpleArray<int>::Count(&L->m_ti);
        ON_SimpleArray<bool>::ON_SimpleArray((ON_SimpleArray<bool> *)&slits.m_count,(long)iVar5);
        iVar5 = ON_SimpleArray<int>::Count(&L->m_ti);
        ON_SimpleArray<int>::ON_SimpleArray((ON_SimpleArray<int> *)local_58,(long)iVar5);
        bVar2 = true;
        bVar3 = false;
        iVar5 = ON_SimpleArray<int>::Count(&L->m_ti);
        for (T._0_4_ = 0; (int)T < iVar5; T._0_4_ = (int)T + 1) {
          piVar8 = ON_SimpleArray<int>::operator[](&L->m_ti,(int)T);
          pOVar9 = ON_ClassArray<ON_BrepTrim>::operator[]
                             ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,*piVar8);
          bVar4 = IsSlitTrim(pOVar9);
          if (bVar4) {
            bUsed.m_capacity._3_1_ = 1;
            ON_SimpleArray<bool>::Append
                      ((ON_SimpleArray<bool> *)&slits.m_count,(bool *)((long)&bUsed.m_capacity + 3))
            ;
            ON_SimpleArray<int>::Append((ON_SimpleArray<int> *)local_58,&pOVar9->m_trim_index);
            bVar3 = true;
          }
          else {
            bUsed.m_capacity._2_1_ = 0;
            ON_SimpleArray<bool>::Append
                      ((ON_SimpleArray<bool> *)&slits.m_count,(bool *)((long)&bUsed.m_capacity + 2))
            ;
            bVar2 = false;
          }
        }
        if (bVar2) {
          ON_Brep::DeleteLoop(this,L,true);
          L_local._7_1_ = true;
          bUsed.m_count = 1;
        }
        else if (bVar3) {
          ON_SimpleArray<bool>::ON_SimpleArray
                    ((ON_SimpleArray<bool> *)&NewLoops.m_count,
                     (ON_SimpleArray<bool> *)&slits.m_count);
          ON_ClassArray<ON_SimpleArray<int>_>::ON_ClassArray
                    ((ON_ClassArray<ON_SimpleArray<int>_> *)&start_trim);
          nl._4_4_ = 0;
          do {
            if (iVar5 <= nl._4_4_) {
LAB_00577694:
              if (nl._4_4_ < iVar5) {
                for (T._0_4_ = 0;
                    iVar5 = ON_ClassArray<ON_SimpleArray<int>_>::Count
                                      ((ON_ClassArray<ON_SimpleArray<int>_> *)&start_trim),
                    (int)T < iVar5; T._0_4_ = (int)T + 1) {
                  pOVar12 = ON_ClassArray<ON_SimpleArray<int>_>::operator[]
                                      ((ON_ClassArray<ON_SimpleArray<int>_> *)&start_trim,(int)T);
                  for (T_2._4_4_ = 0; iVar5 = ON_SimpleArray<int>::Count(pOVar12), T_2._4_4_ < iVar5
                      ; T_2._4_4_ = T_2._4_4_ + 1) {
                    piVar8 = ON_SimpleArray<int>::operator[](pOVar12,T_2._4_4_);
                    piVar8 = ON_SimpleArray<int>::operator[](&L->m_ti,*piVar8);
                    iVar5 = *piVar8;
                    piVar8 = ON_SimpleArray<int>::operator[](pOVar12,T_2._4_4_);
                    *piVar8 = iVar5;
                  }
                }
                TVar1 = L->m_type;
                for (T._0_4_ = 0;
                    iVar5 = ON_SimpleArray<int>::Count((ON_SimpleArray<int> *)local_58),
                    (int)T < iVar5; T._0_4_ = (int)T + 1) {
                  piVar8 = ON_SimpleArray<int>::operator[]((ON_SimpleArray<int> *)local_58,(int)T);
                  pOVar9 = ON_ClassArray<ON_BrepTrim>::operator[]
                                     ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,*piVar8);
                  pOVar9->m_li = -1;
                  ON_Brep::DeleteTrim(this,pOVar9,true);
                }
                ON_SimpleArray<int>::SetCount(&L->m_ti,0);
                ON_Brep::DeleteLoop(this,L,true);
                for (T._0_4_ = 0;
                    iVar5 = ON_ClassArray<ON_SimpleArray<int>_>::Count
                                      ((ON_ClassArray<ON_SimpleArray<int>_> *)&start_trim),
                    (int)T < iVar5; T._0_4_ = (int)T + 1) {
                  loop = ON_Brep::NewLoop(this,unknown,face);
                  pOVar12 = ON_ClassArray<ON_SimpleArray<int>_>::operator[]
                                      ((ON_ClassArray<ON_SimpleArray<int>_> *)&start_trim,(int)T);
                  ON_SimpleArray<int>::operator=(&loop->m_ti,pOVar12);
                  for (T_3._4_4_ = 0; iVar5 = ON_SimpleArray<int>::Count(pOVar12), T_3._4_4_ < iVar5
                      ; T_3._4_4_ = T_3._4_4_ + 1) {
                    piVar8 = ON_SimpleArray<int>::operator[](pOVar12,T_3._4_4_);
                    pOVar9 = ON_ClassArray<ON_BrepTrim>::operator[]
                                       ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,*piVar8);
                    pOVar9->m_li = loop->m_loop_index;
                  }
                  TVar7 = ON_Brep::ComputeLoopType(this,loop);
                  loop->m_type = TVar7;
                  if ((TVar1 == outer) && (loop->m_type == outer)) {
                    piVar8 = ON_SimpleArray<int>::operator[](&face->m_li,0);
                    iVar5 = *piVar8;
                    iVar6 = loop->m_loop_index;
                    piVar8 = ON_SimpleArray<int>::operator[](&face->m_li,0);
                    *piVar8 = iVar6;
                    T_3._4_4_ = ON_SimpleArray<int>::Count(&face->m_li);
                    do {
                      T_3._4_4_ = T_3._4_4_ + -1;
                      if (T_3._4_4_ < 1) goto LAB_00577b9a;
                      piVar8 = ON_SimpleArray<int>::operator[](&face->m_li,T_3._4_4_);
                    } while (*piVar8 != loop->m_loop_index);
                    piVar8 = ON_SimpleArray<int>::operator[](&face->m_li,T_3._4_4_);
                    *piVar8 = iVar5;
                  }
LAB_00577b9a:
                  ON_Brep::MatchTrimEnds(this,loop);
                  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x27])(this,loop,1);
                }
                L_local._7_1_ = true;
              }
              else {
                L_local._7_1_ = false;
              }
              goto LAB_00577be5;
            }
            nl._0_4_ = -1;
            for (T._0_4_ = 0; (int)T < iVar5; T._0_4_ = (int)T + 1) {
              pbVar10 = ON_SimpleArray<bool>::operator[]
                                  ((ON_SimpleArray<bool> *)&NewLoops.m_count,(int)T);
              if ((*pbVar10 & 1U) == 0) {
                nl._0_4_ = (int)T;
                break;
              }
            }
            if ((int)nl < 0) goto LAB_00577694;
            _c = ON_ClassArray<ON_SimpleArray<int>_>::AppendNew
                           ((ON_ClassArray<ON_SimpleArray<int>_> *)&start_trim);
            nl._4_4_ = nl._4_4_ + 1;
            ON_SimpleArray<int>::Append(_c,(int *)&nl);
            pbVar10 = ON_SimpleArray<bool>::operator[]
                                ((ON_SimpleArray<bool> *)&NewLoops.m_count,(int)nl);
            *pbVar10 = true;
            this_trim = ((int)nl + 1) % iVar5;
            local_c8 = 0;
            while (local_c8 < iVar5) {
              pbVar10 = ON_SimpleArray<bool>::operator[]
                                  ((ON_SimpleArray<bool> *)&NewLoops.m_count,this_trim);
              if ((*pbVar10 & 1U) == 0) {
                ON_SimpleArray<int>::Append(_c,&this_trim);
                pbVar10 = ON_SimpleArray<bool>::operator[]
                                    ((ON_SimpleArray<bool> *)&NewLoops.m_count,this_trim);
                *pbVar10 = true;
                this_trim = (this_trim + 1) % iVar5;
                local_c8 = local_c8 + 1;
              }
              else {
                if (this_trim == (int)nl) break;
                pbVar10 = ON_SimpleArray<bool>::operator[]
                                    ((ON_SimpleArray<bool> *)&slits.m_count,this_trim);
                iVar6 = this_trim;
                if ((*pbVar10 & 1U) != 0) {
                  piVar8 = ON_SimpleArray<int>::operator[](&L->m_ti,this_trim);
                  pOVar9 = ON_ClassArray<ON_BrepTrim>::operator[]
                                     ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,*piVar8);
                  pOVar11 = ON_BrepTrim::Edge(pOVar9);
                  piVar8 = ON_SimpleArray<int>::operator[](&pOVar11->m_ti,0);
                  if (*piVar8 == pOVar9->m_trim_index) {
                    piVar8 = ON_SimpleArray<int>::operator[](&pOVar11->m_ti,1);
                    local_1b4 = *piVar8;
                  }
                  else {
                    piVar8 = ON_SimpleArray<int>::operator[](&pOVar11->m_ti,0);
                    local_1b4 = *piVar8;
                  }
                  this_trim = -1;
                  for (T._0_4_ = 0; (int)T < iVar5; T._0_4_ = (int)T + 1) {
                    piVar8 = ON_SimpleArray<int>::operator[](&L->m_ti,(int)T);
                    if (*piVar8 == local_1b4) {
                      this_trim = (int)T;
                      break;
                    }
                  }
                  if (this_trim == -1) {
                    L_local._7_1_ = false;
                    goto LAB_00577be5;
                  }
                  if (iVar6 < this_trim) {
                    iVar6 = -iVar6;
                  }
                  else {
                    iVar6 = iVar5 - iVar6;
                  }
                  local_c8 = this_trim + iVar6 + local_c8;
                  this_trim = (this_trim + 1) % iVar5;
                  local_c8 = local_c8 + 1;
                }
              }
            }
          } while (local_c8 < iVar5);
          L_local._7_1_ = false;
LAB_00577be5:
          bUsed.m_count = 1;
          ON_ClassArray<ON_SimpleArray<int>_>::~ON_ClassArray
                    ((ON_ClassArray<ON_SimpleArray<int>_> *)&start_trim);
          ON_SimpleArray<bool>::~ON_SimpleArray((ON_SimpleArray<bool> *)&NewLoops.m_count);
        }
        else {
          L_local._7_1_ = false;
          bUsed.m_count = 1;
        }
        ON_SimpleArray<int>::~ON_SimpleArray((ON_SimpleArray<int> *)local_58);
        ON_SimpleArray<bool>::~ON_SimpleArray((ON_SimpleArray<bool> *)&slits.m_count);
      }
    }
  }
  return L_local._7_1_;
}

Assistant:

static bool ON_BrepRemoveSlits(ON_BrepLoop& L)

{
  if (L.m_loop_index < 0)
    return false;
  ON_BrepFace* pF = L.Face();
  if (!pF)
    return false;
  ON_Brep* pB = L.Brep();
  if (!pB)
    return false;
  //Check if anything or everything can be removed.
  ON_SimpleArray<bool> bIsSlit(L.m_ti.Count());
  ON_SimpleArray<int> slits(L.m_ti.Count());
  bool all_slits = true;
  bool some_slits = false;
  int tcount = L.m_ti.Count();
  int i;
  for (i=0; i<tcount; i++){
    ON_BrepTrim& T = pB->m_T[L.m_ti[i]];
    if (IsSlitTrim(T)){
      bIsSlit.Append(true);
      slits.Append(T.m_trim_index);
      some_slits = true;
    }
    else {
      bIsSlit.Append(false);
      all_slits = false;
    }
  }

  if (all_slits){
    pB->DeleteLoop(L, true);
    return true;
  }

  if (!some_slits)
    return false;

  ON_SimpleArray<bool> bUsed = bIsSlit;

  ON_ClassArray<ON_SimpleArray<int> > NewLoops;

  //bool done = false;
  int b = 0;
  while (b < tcount){
    int start_trim = -1;
    for (i=0; i<tcount; i++){
      if (!bUsed[i]){
        start_trim = i;
        break;
      }
    }
    if (start_trim < 0)
      break;
    ON_SimpleArray<int>& nl = NewLoops.AppendNew();
    b++;
    nl.Append(start_trim);
    bUsed[start_trim] = true;
    int next_trim = (start_trim+1)%tcount;
    int c = 0;
    while (c < tcount){
      if (!bUsed[next_trim]){
        nl.Append(next_trim);
        bUsed[next_trim] = true;
        next_trim = (next_trim+1)%tcount;
        c++;
        continue;
      }
      if (next_trim == start_trim)
        break;
      if (bIsSlit[next_trim]){
        int this_trim = next_trim;
        ON_BrepTrim& T = pB->m_T[L.m_ti[next_trim]];
        ON_BrepEdge* pE = T.Edge();
        int atid = (pE->m_ti[0] == T.m_trim_index) ? pE->m_ti[1] : pE->m_ti[0];
        next_trim = -1;
        for (i=0; i<tcount; i++){
          if (L.m_ti[i] == atid){
            next_trim = i;
            break;
          }
        }
        if (next_trim == -1)
          return false;
        if (next_trim > this_trim)
          c += next_trim - this_trim;
        else c += tcount - this_trim + next_trim;
        next_trim = (next_trim+1)%tcount;
        c++;
      }
    }
    if (c >= tcount)
      return false;
  }
  if (b >= tcount)
    return false;

  for (i=0; i<NewLoops.Count(); i++){
    ON_SimpleArray<int>& nl = NewLoops[i];
    int j;
    for (j=0; j<nl.Count(); j++)
      nl[j] = L.m_ti[nl[j]];
  }

  bool bOuter = (L.m_type == ON_BrepLoop::outer) ? true : false;

  for (i=0; i<slits.Count(); i++){
    ON_BrepTrim& T = pB->m_T[slits[i]];
    T.m_li = -1;
    pB->DeleteTrim(T, true);
  }

  //int loop_count = pB->m_L.Count();

  L.m_ti.SetCount(0);
  pB->DeleteLoop(L, true);

  for (i=0; i<NewLoops.Count(); i++){
    ON_BrepLoop& nL = pB->NewLoop(ON_BrepLoop::unknown, *pF);
    ON_SimpleArray<int>& nl = NewLoops[i];
    nL.m_ti = nl;
    int j;
    for (j=0; j<nl.Count(); j++){
      ON_BrepTrim& T = pB->m_T[nl[j]];
      T.m_li = nL.m_loop_index;
    }
    nL.m_type = pB->ComputeLoopType(nL);
    if (bOuter && nL.m_type == ON_BrepLoop::outer){
      int a = pF->m_li[0];
      pF->m_li[0] = nL.m_loop_index;
      for (j=pF->m_li.Count()-1; j>0; j--){
        if (pF->m_li[j] == nL.m_loop_index){
          pF->m_li[j] = a;
          break;
        }
      }
    }
    pB->MatchTrimEnds(nL);
    pB->SetTrimBoundingBoxes(nL, true);
  }
  return true;
}